

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-json.c
# Opt level: O2

void test_bson_as_json_double_nonfinite(void)

{
  char cVar1;
  int iVar2;
  undefined8 uVar3;
  char *pcVar4;
  char *__s2;
  size_t len;
  
  uVar3 = bson_new();
  cVar1 = bson_append_double(0x7ff8000000000000,uVar3,"nan",0xffffffffffffffff);
  if (cVar1 == '\0') {
    pcVar4 = "bson_append_double (b, \"nan\", -1, NAN)";
    uVar3 = 0x198;
  }
  else {
    cVar1 = bson_append_double(0x7ff0000000000000,uVar3,"pos_inf",0xffffffffffffffff);
    if (cVar1 == '\0') {
      pcVar4 = "bson_append_double (b, \"pos_inf\", -1, INFINITY)";
      uVar3 = 0x199;
    }
    else {
      cVar1 = bson_append_double(0xfff0000000000000,uVar3,"neg_inf",0xffffffffffffffff);
      if (cVar1 != '\0') {
        pcVar4 = (char *)bson_as_json(uVar3,&len);
        __s2 = (char *)bson_strdup_printf(0x7ff8000000000000,0x7ff0000000000000,0xfff0000000000000,
                                          "{ \"nan\" : %.20g, \"pos_inf\" : %.20g, \"neg_inf\" : %.20g }"
                                         );
        if (pcVar4 != __s2) {
          iVar2 = strcmp(pcVar4,__s2);
          if (iVar2 != 0) {
            fprintf(_stderr,"FAIL\n\nAssert Failure: \"%s\" != \"%s\"\n",pcVar4,__s2);
            abort();
          }
        }
        bson_free(__s2);
        bson_free(pcVar4);
        bson_destroy(uVar3);
        return;
      }
      pcVar4 = "bson_append_double (b, \"neg_inf\", -1, -INFINITY)";
      uVar3 = 0x19a;
    }
  }
  fprintf(_stderr,"%s:%d %s(): precondition failed: %s\n",
          "/workspace/llm4binary/github/license_c_cmakelists/mongodb[P]libbson/tests/test-json.c",
          uVar3,"test_bson_as_json_double_nonfinite",pcVar4);
  abort();
}

Assistant:

static void
test_bson_as_json_double_nonfinite (void)
{
   size_t len;
   bson_t *b;
   char *str;
   char *expected;

   b = bson_new ();
   BSON_ASSERT (bson_append_double (b, "nan", -1, NAN));
   BSON_ASSERT (bson_append_double (b, "pos_inf", -1, INFINITY));
   BSON_ASSERT (bson_append_double (b, "neg_inf", -1, -INFINITY));
   str = bson_as_json (b, &len);

   expected = bson_strdup_printf ("{"
                                  " \"nan\" : %.20g,"
                                  " \"pos_inf\" : %.20g,"
                                  " \"neg_inf\" : %.20g }",
                                  NAN,
                                  INFINITY,
                                  -INFINITY);

   ASSERT_CMPSTR (str, expected);

   bson_free (expected);
   bson_free (str);
   bson_destroy (b);
}